

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool perfetto::anon_unknown_4::NameMatchesFilter
               (string *name,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *name_filter,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *name_regex_filter)

{
  pointer pbVar1;
  pointer pbVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  bool bVar5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  long lVar7;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __it_00;
  string *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  pbVar1 = (name_filter->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (name_filter->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if ((pbVar1 == pbVar2) &&
     ((name_regex_filter->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (name_regex_filter->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    return true;
  }
  _Var6 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (pbVar1,pbVar2,name);
  pbVar3 = (name_filter->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  __it_00._M_current =
       (name_regex_filter->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  local_38 = (name_regex_filter->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  lVar7 = (long)local_38 - (long)__it_00._M_current >> 7;
  local_40 = name;
  if (0 < lVar7) {
    lVar7 = lVar7 + 1;
    do {
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
              ::operator()((_Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                            *)&local_40,__it_00);
      __it._M_current = __it_00._M_current;
      if (bVar5) goto LAB_002d533a;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
              ::operator()((_Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                            *)&local_40,__it_00._M_current + 1);
      __it._M_current = __it_00._M_current + 1;
      if (bVar5) goto LAB_002d533a;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
              ::operator()((_Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                            *)&local_40,__it_00._M_current + 2);
      __it._M_current = __it_00._M_current + 2;
      if (bVar5) goto LAB_002d533a;
      bVar5 = __gnu_cxx::__ops::
              _Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
              ::operator()((_Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                            *)&local_40,__it_00._M_current + 3);
      __it._M_current = __it_00._M_current + 3;
      if (bVar5) goto LAB_002d533a;
      __it_00._M_current = __it_00._M_current + 4;
      lVar7 = lVar7 + -1;
    } while (1 < lVar7);
  }
  pbVar4 = local_38;
  lVar7 = (long)local_38 - (long)__it_00._M_current >> 5;
  if (lVar7 != 1) {
    __it._M_current = __it_00._M_current;
    if (lVar7 != 2) {
      __it._M_current = pbVar4;
      if ((lVar7 != 3) ||
         (bVar5 = __gnu_cxx::__ops::
                  _Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
                  ::operator()((_Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                                *)&local_40,__it_00), __it._M_current = __it_00._M_current, bVar5))
      goto LAB_002d533a;
      __it._M_current = __it_00._M_current + 1;
    }
    bVar5 = __gnu_cxx::__ops::
            _Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
            ::operator()((_Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                          *)&local_40,__it);
    if (bVar5) goto LAB_002d533a;
    __it_00._M_current = __it._M_current + 1;
  }
  bVar5 = __gnu_cxx::__ops::
          _Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::$_0>
          ::operator()((_Iter_pred<perfetto::(anonymous_namespace)::NameMatchesFilter(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::__0>
                        *)&local_40,__it_00);
  __it._M_current = pbVar4;
  if (bVar5) {
    __it._M_current = __it_00._M_current;
  }
LAB_002d533a:
  return __it._M_current !=
         (name_regex_filter->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_finish || _Var6._M_current != pbVar3;
}

Assistant:

bool NameMatchesFilter(const std::string& name,
                       const std::vector<std::string>& name_filter,
                       const std::vector<std::string>& name_regex_filter) {
  bool filter_is_set = !name_filter.empty() || !name_regex_filter.empty();
  if (!filter_is_set)
    return true;
  bool filter_matches = std::find(name_filter.begin(), name_filter.end(),
                                  name) != name_filter.end();
  bool filter_regex_matches =
      std::find_if(name_regex_filter.begin(), name_regex_filter.end(),
                   [&](const std::string& regex) {
                     return std::regex_match(
                         name, std::regex(regex, std::regex::extended));
                   }) != name_regex_filter.end();
  return filter_matches || filter_regex_matches;
}